

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_request.cpp
# Opt level: O2

void __thiscall cube::http::HTTPRequest::Reset(HTTPRequest *this)

{
  string local_40;
  allocator local_19;
  
  logging::GetLogger();
  (**(code **)(*(long *)local_40._M_dataplus._M_p + 0x18))
            (local_40._M_dataplus._M_p,"%s|%d|%s|TRACE|\n",
             "/workspace/llm4binary/github/license_c_cmakelists/yplusplus[P]cube/net/http/http_request.cpp"
             ,0x68,"Reset");
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_40._M_string_length);
  std::__cxx11::string::string((string *)&local_40,"GET",&local_19);
  std::__cxx11::string::_M_assign((string *)&this->m_method);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string((string *)&local_40,"/",&local_19);
  SetURL(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::_M_assign((string *)&this->m_proto);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear(&(this->m_headers)._M_t);
  (this->m_body)._M_string_length = 0;
  *(this->m_body)._M_dataplus._M_p = '\0';
  this->m_parse_state = PARSE_REQUEST_LINE;
  return;
}

Assistant:

void HTTPRequest::Reset() {
    M_LOG_TRACE("");
    SetMethod("GET");
    SetURL("/");
    SetProto(HTTP_VERSION_1_1);
    m_headers.clear();
    m_body.clear();
    m_parse_state = PARSE_REQUEST_LINE;
}